

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O1

PointerType * LLVMBC::PointerType::get(Type *pointee,uint addr_space)

{
  pointer *pppTVar1;
  LLVMContext *this;
  PointerType *pPVar2;
  iterator __position;
  bool bVar3;
  bool bVar4;
  pointer ppTVar5;
  uint in_ESI;
  Type *in_RDI;
  PointerType *pointer_type;
  PointerType *unaff_R14;
  uint local_24;
  PointerType *local_20;
  Type *local_18;
  
  this = in_RDI->context;
  for (ppTVar5 = (this->type_cache).
                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = ppTVar5 ==
              (this->type_cache).
              super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_finish, !bVar4; ppTVar5 = ppTVar5 + 1) {
    pPVar2 = (PointerType *)*ppTVar5;
    bVar3 = true;
    if ((((pPVar2->super_Type).type_id == PointerTyID) &&
        ((pPVar2->super_Type).address_space == in_ESI)) && (pPVar2->contained_type == in_RDI)) {
      bVar3 = false;
      unaff_R14 = pPVar2;
    }
    if (!bVar3) break;
  }
  if (bVar4) {
    unaff_R14 = LLVMContext::construct<LLVMBC::PointerType,LLVMBC::Type*&,unsigned_int&>
                          (this,&local_18,&local_24);
    __position._M_current =
         (this->type_cache).
         super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_20 = unaff_R14;
      std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
      _M_realloc_insert<LLVMBC::Type*>
                ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                 &this->type_cache,__position,(Type **)&local_20);
    }
    else {
      *__position._M_current = &unaff_R14->super_Type;
      pppTVar1 = &(this->type_cache).
                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return unaff_R14;
}

Assistant:

PointerType *PointerType::get(Type *pointee, unsigned addr_space)
{
	auto &context = pointee->getContext();
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
	{
		if (type->getTypeID() == TypeID::PointerTyID)
		{
			auto *pointer_type = cast<PointerType>(type);
			if (pointer_type->getAddressSpace() == addr_space && pointer_type->getElementType() == pointee)
				return pointer_type;
		}
	}

	auto *type = context.construct<PointerType>(pointee, addr_space);
	cache.push_back(type);
	return type;
}